

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

void __thiscall LoaderLogger::LoaderLogger(LoaderLogger *this)

{
  bool bVar1;
  ulong uVar2;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> local_58;
  undefined8 local_50;
  XrLoaderLogMessageSeverityFlags debug_flags;
  undefined1 local_30 [8];
  string debug_string;
  LoaderLogger *this_local;
  
  debug_string.field_2._8_8_ = this;
  std::shared_timed_mutex::shared_timed_mutex(&this->_mutex);
  std::
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ::vector(&this->_recorders);
  std::
  unordered_map<XrInstance_T_*,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map(&this->_recordersByInstance);
  DebugUtilsData::DebugUtilsData(&this->data_);
  PlatformUtilsGetEnv_abi_cxx11_((string *)local_30,"XR_LOADER_DEBUG");
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"none");
  if (bVar1) {
    MakeStdErrLoaderLogRecorder(&debug_flags);
    AddLogRecorder(this,(unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
                        &debug_flags);
    std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::~unique_ptr
              ((unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
               &debug_flags);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_50 = 0;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"error");
    if (bVar1) {
      local_50 = 0x1000;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"warn");
      if (bVar1) {
        local_50 = 0x1100;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"info");
        if (bVar1) {
          local_50 = 0x1110;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"all");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30,"verbose"), bVar1)) {
            local_50 = 0x1111;
          }
        }
      }
    }
    MakeStdOutLoaderLogRecorder(&local_58,0);
    AddLogRecorder(this,&local_58);
    std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::~unique_ptr
              (&local_58);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

LoaderLogger::LoaderLogger() {
    std::string debug_string = PlatformUtilsGetEnv("XR_LOADER_DEBUG");

    // Add an error logger by default so that we at least get errors out to std::cerr.
    // Normally we enable stderr output. But if the XR_LOADER_DEBUG environment variable is
    // present as "none" then we don't.
    if (debug_string != "none") {
        AddLogRecorder(MakeStdErrLoaderLogRecorder(nullptr));
#ifdef __ANDROID__
        // Add a logcat logger by default.
        AddLogRecorder(MakeLogcatLoaderLogRecorder());
#endif  // __ANDROID__
    }

#ifdef _WIN32
    // Add an debugger logger by default so that we at least get errors out to the debugger.
    AddLogRecorder(MakeDebuggerLoaderLogRecorder(nullptr));
#endif

    // If the environment variable to enable loader debugging is set, then enable the
    // appropriate logging out to std::cout.
    if (!debug_string.empty()) {
        XrLoaderLogMessageSeverityFlags debug_flags = {};
        if (debug_string == "error") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT;
        } else if (debug_string == "warn") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT;
        } else if (debug_string == "info") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT |
                          XR_LOADER_LOG_MESSAGE_SEVERITY_INFO_BIT;
        } else if (debug_string == "all" || debug_string == "verbose") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT |
                          XR_LOADER_LOG_MESSAGE_SEVERITY_INFO_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_VERBOSE_BIT;
        }
        AddLogRecorder(MakeStdOutLoaderLogRecorder(nullptr, debug_flags));
    }
}